

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

SynchEvent * absl::lts_20250127::GetSynchEvent(void *addr)

{
  SynchEvent *pSVar1;
  SynchEvent **ppSVar2;
  
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  ppSVar2 = (SynchEvent **)(&synch_event + (ulong)addr % 0x407);
  do {
    pSVar1 = *ppSVar2;
    if (pSVar1 == (SynchEvent *)0x0) {
LAB_00268b12:
      base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
      return pSVar1;
    }
    if ((pSVar1->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      pSVar1->refcount = pSVar1->refcount + 1;
      goto LAB_00268b12;
    }
    ppSVar2 = &pSVar1->next;
  } while( true );
}

Assistant:

static SynchEvent* GetSynchEvent(const void* addr) {
  uint32_t h = reinterpret_cast<uintptr_t>(addr) % kNSynchEvent;
  SynchEvent* e;
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e != nullptr) {
    e->refcount++;
  }
  synch_event_mu.Unlock();
  return e;
}